

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O0

void __thiscall
gmath::SturmChain<double>::SturmChain(SturmChain<double> *this,Polynomial<double> *p)

{
  undefined1 auVar1 [16];
  int iVar2;
  Polynomial<double> *p_00;
  ulong uVar3;
  ulong *puVar4;
  Polynomial<double> *pPVar5;
  Polynomial<double> *pPVar6;
  Polynomial<double> *in_RSI;
  int *in_RDI;
  ulong uVar7;
  double dVar8;
  bool compute;
  Polynomial<double> r;
  Polynomial<double> q;
  Polynomial<double> *in_stack_ffffffffffffff50;
  Polynomial<double> *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar9;
  Polynomial<double> *in_stack_ffffffffffffff78;
  Polynomial<double> *in_stack_ffffffffffffffa8;
  Polynomial<double> *in_stack_ffffffffffffffb0;
  Polynomial<double> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar10;
  undefined4 in_stack_ffffffffffffffc4;
  Polynomial<double> local_30 [2];
  Polynomial<double> *local_10;
  
  local_10 = in_RSI;
  Polynomial<double>::Polynomial(in_stack_ffffffffffffff50);
  Polynomial<double>::Polynomial(in_stack_ffffffffffffff50);
  *in_RDI = 0;
  iVar2 = Polynomial<double>::getDegree(local_10);
  p_00 = (Polynomial<double> *)(long)(iVar2 + 1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = p_00;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar7 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar7 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar7);
  *puVar4 = (ulong)p_00;
  pPVar5 = (Polynomial<double> *)(puVar4 + 1);
  if (p_00 != (Polynomial<double> *)0x0) {
    pPVar6 = pPVar5 + (long)p_00;
    in_stack_ffffffffffffff78 = pPVar5;
    do {
      Polynomial<double>::Polynomial(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1;
    } while (in_stack_ffffffffffffff78 != pPVar6);
  }
  *(Polynomial<double> **)(in_RDI + 2) = pPVar5;
  Polynomial<double>::operator=
            ((Polynomial<double> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
             in_stack_ffffffffffffff58);
  uVar10 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
LAB_0011f789:
  uVar9 = false;
  if ((uVar10 & 0x1000000) != 0) {
    iVar2 = Polynomial<double>::getDegree(*(Polynomial<double> **)(in_RDI + 2));
    uVar9 = 0 < iVar2;
  }
  if ((bool)uVar9 == false) {
    Polynomial<double>::~Polynomial(in_stack_ffffffffffffff50);
    Polynomial<double>::~Polynomial(in_stack_ffffffffffffff50);
    return;
  }
  uVar10 = uVar10 & 0xffffff;
  d<double>(p_00);
  Polynomial<double>::operator=
            ((Polynomial<double> *)
             CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
             ,in_stack_ffffffffffffff58);
  Polynomial<double>::~Polynomial(in_stack_ffffffffffffff50);
  *in_RDI = 2;
  do {
    in_stack_ffffffffffffff60 = *in_RDI;
    iVar2 = Polynomial<double>::getDegree(*(Polynomial<double> **)(in_RDI + 2));
    in_stack_ffffffffffffff66 = false;
    if (in_stack_ffffffffffffff60 < iVar2 + 1) {
      iVar2 = Polynomial<double>::getDegree
                        ((Polynomial<double> *)(*(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x10)
                        );
      in_stack_ffffffffffffff66 = 0 < iVar2;
    }
    if ((bool)in_stack_ffffffffffffff66 == false) goto LAB_0011f789;
    div<double>((Polynomial<double> *)CONCAT44(in_stack_ffffffffffffffc4,uVar10),
                in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar2 = Polynomial<double>::getDegree(local_30);
    if (iVar2 == 0) {
      dVar8 = Polynomial<double>::operator[](local_30,0);
      if ((dVar8 == 0.0) && (!NAN(dVar8))) break;
    }
    Polynomial<double>::operator-(in_stack_ffffffffffffff78);
    Polynomial<double>::operator=
              ((Polynomial<double> *)
               CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff66,
                                       CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                      )),in_stack_ffffffffffffff58);
    Polynomial<double>::~Polynomial(in_stack_ffffffffffffff50);
    *in_RDI = *in_RDI + 1;
  } while( true );
  div<double>((Polynomial<double> *)CONCAT44(in_stack_ffffffffffffffc4,uVar10),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Polynomial<double>::operator=
            ((Polynomial<double> *)
             CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
             ,in_stack_ffffffffffffff58);
  uVar10 = CONCAT13(1,(int3)uVar10);
  goto LAB_0011f789;
}

Assistant:

SturmChain(const Polynomial<T> &p)
    {
      Polynomial<T> q, r;

      assert(p.getDegree() > 0);

      n=0;
      f=new Polynomial<T> [p.getDegree()+1];

      f[0]=p;

      bool compute=true;

      while (compute && f[0].getDegree() > 0)
      {
        compute=false;

        f[1]=d(f[0]);

        n=2;

        while (n < f[0].getDegree()+1 && f[n-1].getDegree() > 0)
        {
          div(f[n-2], f[n-1], q, r);

          // check for multiple roots

          if (r.getDegree() == 0 && r[0] == 0)
          {
            // f[n-1] is the common divisor of f[0], divide it out to get
            // rid of multiple roots and restart computation of Sturm chain

            div(f[0], f[n-1], q, r);
            f[0]=q;
            compute=true;
            break;
          }

          f[n]=-r;
          n++;
        }
      }
    }